

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

void __thiscall QCborStreamWriter::append(QCborStreamWriter *this,qfloat16 f)

{
  _Head_base<0UL,_QCborStreamWriterPrivate_*,_false> _Var1;
  QIODevice *this_00;
  size_t __n;
  long in_FS_OFFSET;
  undefined1 local_11;
  ushort local_10;
  undefined6 uStack_e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QCborStreamWriterPrivate,_std::default_delete<QCborStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QCborStreamWriterPrivate_*,_std::default_delete<QCborStreamWriterPrivate>_>
       .super__Head_base<0UL,_QCborStreamWriterPrivate_*,_false>._M_head_impl;
  local_11 = 0xf9;
  _local_10 = CONCAT62(0xaaaaaaaaaaaa,(short)f.field_0 << 8 | (ushort)f.field_0 >> 8);
  __n = *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10);
  if (__n != 0) {
    __n = __n - 1;
    *(size_t *)((long)&(_Var1._M_head_impl)->encoder + 0x10) = __n;
  }
  this_00 = *(QIODevice **)*(uint8_t **)((long)&(_Var1._M_head_impl)->encoder + 8);
  if (this_00 != (QIODevice *)0x0) {
    QIODevice::write(this_00,(int)&local_11,(void *)0x3,__n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborStreamWriter::append(qfloat16 f)
{
    d->executeAppend(cbor_encode_half_float, static_cast<const void *>(&f));
}